

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QOpenGLSharedResource_*>::begin(QList<QOpenGLSharedResource_*> *this)

{
  QOpenGLSharedResource **n;
  QArrayDataPointer<QOpenGLSharedResource_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QOpenGLSharedResource_*> *)0x8f94e9);
  QArrayDataPointer<QOpenGLSharedResource_*>::operator->(in_RDI);
  n = QArrayDataPointer<QOpenGLSharedResource_*>::begin
                ((QArrayDataPointer<QOpenGLSharedResource_*> *)0x8f94fa);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }